

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha.h
# Opt level: O3

SHA1 * __thiscall sha1::SHA1::processByte(SHA1 *this,uint8_t octet)

{
  size_t sVar1;
  
  sVar1 = this->m_blockByteIndex;
  this->m_blockByteIndex = sVar1 + 1;
  this->m_block[sVar1] = octet;
  this->m_byteCount = this->m_byteCount + 1;
  if (this->m_blockByteIndex == 0x40) {
    this->m_blockByteIndex = 0;
    processBlock(this);
  }
  return this;
}

Assistant:

SHA1 &processByte(uint8_t octet) {
    this->m_block[this->m_blockByteIndex++] = octet;
    ++this->m_byteCount;
    if (m_blockByteIndex == 64) {
      this->m_blockByteIndex = 0;
      processBlock();
    }
    return *this;
  }